

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProvingHelper.cpp
# Opt level: O0

void Saturation::ProvingHelper::runVampireSaturation(Problem *prb,Options *opt)

{
  bad_alloc *anon_var_0;
  TimeLimitExceededException *anon_var_0_1;
  ActivationLimitExceededException *anon_var_0_2;
  
  runVampireSaturationImpl(prb,opt);
  return;
}

Assistant:

void ProvingHelper::runVampireSaturation(Problem& prb, const Options& opt)
{
  try {
    runVampireSaturationImpl(prb, opt);
  }
  catch(const std::bad_alloc &) {
    env.statistics->terminationReason=TerminationReason::MEMORY_LIMIT;
    env.statistics->refutation=0;
  }
  catch(TimeLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::TIME_LIMIT;
    env.statistics->refutation=0;
  }
  catch(ActivationLimitExceededException&) {
    env.statistics->terminationReason=TerminationReason::ACTIVATION_LIMIT;
    env.statistics->refutation=0;
  }
}